

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O3

void __thiscall duckdb::LogicalOperator::PrintColumnBindings(LogicalOperator *this)

{
  vector<duckdb::ColumnBinding,_true> *bindings;
  undefined1 local_40 [40];
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  local_18 [2];
  
  (*this->_vptr_LogicalOperator[2])((LogicalOperator *)local_40,this);
  ColumnBindingsToString_abi_cxx11_
            ((string *)(local_40 + 0x18),(LogicalOperator *)local_40,bindings);
  Printer::Print((string *)(local_40 + 0x18));
  if ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *)
      local_40._24_8_ != local_18) {
    operator_delete((void *)local_40._24_8_);
  }
  if ((_func_int **)local_40._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_40._0_8_);
  }
  return;
}

Assistant:

void LogicalOperator::PrintColumnBindings() {
	Printer::Print(ColumnBindingsToString(GetColumnBindings()));
}